

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
             *this,char **it)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  size_t __len;
  char *pcVar7;
  ptrdiff_t _Num;
  bool bVar8;
  bool bVar9;
  
  sVar2 = *(size_t *)(this + 0x10);
  if (sVar2 != 0) {
    pcVar7 = *it;
    memmove(pcVar7,*(void **)(this + 8),sVar2);
    *it = pcVar7 + sVar2;
  }
  __s = *it;
  sVar2 = *(size_t *)(this + 0x20);
  pcVar7 = __s;
  if (sVar2 != 0) {
    pcVar7 = __s + sVar2;
    memset(__s,*(int *)(this + 0x18),sVar2);
  }
  *it = pcVar7;
  iVar1 = *(int *)(this + 0x40);
  pbVar5 = (byte *)(__s + sVar2 + (long)iVar1);
  uVar4 = *(ulong *)(this + 0x30);
  uVar6 = *(ulong *)(this + 0x38);
  do {
    pbVar5 = pbVar5 + -1;
    *pbVar5 = (byte)uVar4 & 1 | 0x30;
    bVar8 = 1 < uVar4;
    bVar9 = uVar6 != 0;
    uVar3 = -uVar6;
    uVar4 = uVar6 << 0x3f | uVar4 >> 1;
    uVar6 = uVar6 >> 1;
  } while (bVar9 || uVar3 < bVar8);
  *it = pcVar7 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }